

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototype(DynamicMessageFactory *this,Descriptor *type)

{
  Message *pMVar1;
  
  std::mutex::lock(&(this->prototypes_mutex_).mu_);
  pMVar1 = GetPrototypeNoLock(this,type);
  pthread_mutex_unlock((pthread_mutex_t *)&this->prototypes_mutex_);
  return pMVar1;
}

Assistant:

const Message* DynamicMessageFactory::GetPrototype(const Descriptor* type) {
  MutexLock lock(&prototypes_mutex_);
  return GetPrototypeNoLock(type);
}